

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O2

Image * __thiscall
deqp::gls::FboUtil::config::Framebuffer::getImage(Framebuffer *this,GLenum type,GLuint imgName)

{
  mapped_type *ppTVar1;
  GLuint local_c;
  mapped_type local_8;
  
  local_c = imgName;
  if (type == 0x8d41) {
    local_8 = (mapped_type)0x0;
    ppTVar1 = (mapped_type *)
              de::
              lookupDefault<std::map<unsigned_int,deqp::gls::FboUtil::config::Renderbuffer_const*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,deqp::gls::FboUtil::config::Renderbuffer_const*>>>>
                        (&this->rbos,&local_c,(mapped_type *)&local_8);
  }
  else {
    if (type != 0x1702) {
      return (Image *)0x0;
    }
    local_8 = (mapped_type)0x0;
    ppTVar1 = de::
              lookupDefault<std::map<unsigned_int,deqp::gls::FboUtil::config::Texture_const*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,deqp::gls::FboUtil::config::Texture_const*>>>>
                        (&this->textures,&local_c,&local_8);
  }
  return &(*ppTVar1)->super_Image;
}

Assistant:

const Image* Framebuffer::getImage (GLenum type, glw::GLuint imgName) const
{
	switch (type)
	{
		case GL_TEXTURE:
			return de::lookupDefault(textures, imgName, DE_NULL);
		case GL_RENDERBUFFER:
			return de::lookupDefault(rbos, imgName, DE_NULL);
		default:
			DE_FATAL("Bad image type");
	}
	return DE_NULL; // shut up compiler warning
}